

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O2

void __thiscall QProgressDialog::changeEvent(QProgressDialog *this,QEvent *ev)

{
  QProgressDialogPrivate *this_00;
  
  this_00 = *(QProgressDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if (*(short *)(ev + 8) == 0x59) {
    QProgressDialogPrivate::retranslateStrings(this_00);
  }
  else if (*(short *)(ev + 8) == 100) {
    QProgressDialogPrivate::layout(this_00);
  }
  QWidget::changeEvent((QWidget *)this,ev);
  return;
}

Assistant:

void QProgressDialog::changeEvent(QEvent *ev)
{
    Q_D(QProgressDialog);
    if (ev->type() == QEvent::StyleChange) {
        d->layout();
    } else if (ev->type() == QEvent::LanguageChange) {
        d->retranslateStrings();
    }
    QDialog::changeEvent(ev);
}